

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcolordialog.cpp
# Opt level: O0

void __thiscall QtPrivate::QWellArray::paintEvent(QWellArray *this,QPaintEvent *e)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  QRect *pQVar5;
  QPaintEvent *in_RSI;
  QWellArray *in_RDI;
  long in_FS_OFFSET;
  int colp;
  int c;
  int rowp;
  int r_1;
  QPainter *p;
  int t;
  int rowlast;
  int rowfirst;
  int collast;
  int colfirst;
  int cw;
  int ch;
  int cy;
  int cx;
  QRect rect;
  QPainter painter;
  QRect r;
  int in_stack_ffffffffffffff68;
  int in_stack_ffffffffffffff6c;
  int in_stack_ffffffffffffff70;
  int in_stack_ffffffffffffff74;
  int local_7c;
  int local_74;
  int local_60;
  int local_58;
  int local_54;
  undefined1 *local_30;
  undefined1 *local_28;
  undefined1 *local_20;
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_18 = &DAT_aaaaaaaaaaaaaaaa;
  local_10 = &DAT_aaaaaaaaaaaaaaaa;
  pQVar5 = QPaintEvent::rect(in_RSI);
  local_18._0_4_ = pQVar5->x1;
  local_18._4_4_ = pQVar5->y1;
  local_10._0_4_ = pQVar5->x2;
  local_10._4_4_ = pQVar5->y2;
  QRect::x((QRect *)0x730bdc);
  iVar2 = QRect::y((QRect *)0x730bed);
  iVar3 = QRect::height((QRect *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
  QRect::width((QRect *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
  iVar4 = columnAt(in_RDI,in_stack_ffffffffffffff74);
  local_54 = columnAt(in_RDI,in_stack_ffffffffffffff74);
  local_74 = rowAt(in_RDI,iVar2);
  local_60 = rowAt(in_RDI,iVar2 + iVar3);
  bVar1 = QWidget::isRightToLeft((QWidget *)0x730c6d);
  local_58 = iVar4;
  if (!bVar1) {
    local_58 = local_54;
    local_54 = iVar4;
  }
  local_20 = &DAT_aaaaaaaaaaaaaaaa;
  QPainter::QPainter((QPainter *)&local_20,&(in_RDI->super_QWidget).super_QPaintDevice);
  local_30 = &DAT_aaaaaaaaaaaaaaaa;
  local_28 = &DAT_aaaaaaaaaaaaaaaa;
  iVar2 = cellWidth(in_RDI);
  cellHeight(in_RDI);
  QRect::QRect((QRect *)in_RDI,iVar2,in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c,
               in_stack_ffffffffffffff68);
  if ((local_58 < 0) || (in_RDI->ncols <= local_58)) {
    local_58 = in_RDI->ncols + -1;
  }
  if ((local_60 < 0) || (in_RDI->nrows <= local_60)) {
    local_60 = in_RDI->nrows + -1;
  }
  for (; local_74 <= local_60; local_74 = local_74 + 1) {
    rowY(in_RDI,local_74);
    for (local_7c = local_54; local_7c <= local_58; local_7c = local_7c + 1) {
      columnX(in_RDI,iVar2);
      QRect::translate((QRect *)CONCAT44(iVar2,in_stack_ffffffffffffff70),in_stack_ffffffffffffff6c,
                       in_stack_ffffffffffffff68);
      (**(code **)(*(long *)&in_RDI->super_QWidget + 0x1b0))
                (in_RDI,&local_20,local_74,local_7c,&local_30);
      QRect::translate((QRect *)CONCAT44(iVar2,in_stack_ffffffffffffff70),in_stack_ffffffffffffff6c,
                       in_stack_ffffffffffffff68);
    }
  }
  QPainter::~QPainter((QPainter *)&local_20);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QWellArray::paintEvent(QPaintEvent *e)
{
    QRect r = e->rect();
    int cx = r.x();
    int cy = r.y();
    int ch = r.height();
    int cw = r.width();
    int colfirst = columnAt(cx);
    int collast = columnAt(cx + cw);
    int rowfirst = rowAt(cy);
    int rowlast = rowAt(cy + ch);

    if (isRightToLeft()) {
        int t = colfirst;
        colfirst = collast;
        collast = t;
    }

    QPainter painter(this);
    QPainter *p = &painter;
    QRect rect(0, 0, cellWidth(), cellHeight());


    if (collast < 0 || collast >= ncols)
        collast = ncols-1;
    if (rowlast < 0 || rowlast >= nrows)
        rowlast = nrows-1;

    // Go through the rows
    for (int r = rowfirst; r <= rowlast; ++r) {
        // get row position and height
        int rowp = rowY(r);

        // Go through the columns in the row r
        // if we know from where to where, go through [colfirst, collast],
        // else go through all of them
        for (int c = colfirst; c <= collast; ++c) {
            // get position and width of column c
            int colp = columnX(c);
            // Translate painter and draw the cell
            rect.translate(colp, rowp);
            paintCell(p, r, c, rect);
            rect.translate(-colp, -rowp);
        }
    }
}